

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O0

Move<vk::VkDevice_s_*> * __thiscall
vkt::sr::ShaderRenderCaseInstance::SparseContext::createDevice
          (Move<vk::VkDevice_s_*> *__return_storage_ptr__,SparseContext *this)

{
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice_00;
  undefined4 local_17c;
  undefined1 local_178 [4];
  float queuePriority;
  VkDeviceCreateInfo deviceInfo;
  VkDeviceQueueCreateInfo queueInfo;
  VkPhysicalDeviceFeatures deviceFeatures;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *vk;
  SparseContext *this_local;
  
  vk_00 = Context::getInstanceInterface(this->m_context);
  physicalDevice_00 = Context::getPhysicalDevice(this->m_context);
  ::vk::getPhysicalDeviceFeatures
            ((VkPhysicalDeviceFeatures *)((long)&queueInfo.pQueuePriorities + 4),vk_00,
             physicalDevice_00);
  local_17c = 0x3f800000;
  ::deMemset(&deviceInfo.pEnabledFeatures,0,0x28);
  ::deMemset(local_178,0,0x48);
  deviceInfo.pEnabledFeatures._0_4_ = 2;
  queueInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  queueInfo._4_4_ = 0;
  queueInfo.pNext._0_4_ = 0;
  queueInfo.pNext._4_4_ = this->m_queueFamilyIndex;
  queueInfo.flags = 1;
  queueInfo._24_8_ = &local_17c;
  local_178 = (undefined1  [4])0x3;
  deviceInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  deviceInfo._4_4_ = 0;
  deviceInfo.pNext._4_4_ = 1;
  deviceInfo._16_8_ = &deviceInfo.pEnabledFeatures;
  deviceInfo.ppEnabledLayerNames._0_4_ = 0;
  deviceInfo.enabledExtensionCount = 0;
  deviceInfo._52_4_ = 0;
  deviceInfo.pQueueCreateInfos._0_4_ = 0;
  deviceInfo.enabledLayerCount = 0;
  deviceInfo._36_4_ = 0;
  deviceInfo.ppEnabledExtensionNames = (char **)((long)&queueInfo.pQueuePriorities + 4);
  ::vk::createDevice(__return_storage_ptr__,vk_00,physicalDevice_00,(VkDeviceCreateInfo *)local_178,
                     (VkAllocationCallbacks *)0x0);
  return __return_storage_ptr__;
}

Assistant:

Move<VkDevice> ShaderRenderCaseInstance::SparseContext::createDevice () const
{
	const InstanceInterface&				vk					= m_context.getInstanceInterface();
	const VkPhysicalDevice					physicalDevice		= m_context.getPhysicalDevice();
	const VkPhysicalDeviceFeatures			deviceFeatures		= getPhysicalDeviceFeatures(vk, physicalDevice);

	VkDeviceQueueCreateInfo					queueInfo;
	VkDeviceCreateInfo						deviceInfo;
	const float								queuePriority		= 1.0f;

	deMemset(&queueInfo,	0, sizeof(queueInfo));
	deMemset(&deviceInfo,	0, sizeof(deviceInfo));

	queueInfo.sType							= VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
	queueInfo.pNext							= DE_NULL;
	queueInfo.flags							= (VkDeviceQueueCreateFlags)0u;
	queueInfo.queueFamilyIndex				= m_queueFamilyIndex;
	queueInfo.queueCount					= 1u;
	queueInfo.pQueuePriorities				= &queuePriority;

	deviceInfo.sType						= VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
	deviceInfo.pNext						= DE_NULL;
	deviceInfo.queueCreateInfoCount			= 1u;
	deviceInfo.pQueueCreateInfos			= &queueInfo;
	deviceInfo.enabledExtensionCount		= 0u;
	deviceInfo.ppEnabledExtensionNames		= DE_NULL;
	deviceInfo.enabledLayerCount			= 0u;
	deviceInfo.ppEnabledLayerNames			= DE_NULL;
	deviceInfo.pEnabledFeatures				= &deviceFeatures;

	return vk::createDevice(vk, physicalDevice, &deviceInfo);
}